

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith.hpp
# Opt level: O3

size_t interp_decompress(uint32_t *obuff,size_t osize,uint8_t *ibuff,size_t isize)

{
  uint32_t *puVar1;
  undefined1 auVar2 [16];
  unsigned_long uVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  ulong uVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  size_t sVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  vector<unsigned_long,_std::allocator<unsigned_long>_> T;
  allocator_type local_49;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_48,osize * 2 - 1,&local_49);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(ulong *)ibuff;
  auVar22 = vpmovzxbq_avx512f(auVar2);
  sVar20 = 8;
  auVar22 = vpsllvq_avx512f(auVar22,_DAT_0013d0c0);
  auVar21 = vextracti64x4_avx512f(auVar22,1);
  auVar22 = vpaddq_avx512f(auVar22,ZEXT3264(auVar21));
  auVar2 = vpaddq_avx(auVar22._0_16_,auVar22._16_16_);
  auVar12 = vpshufd_avx(auVar2,0xee);
  auVar2 = vpaddq_avx(auVar2,auVar12);
  *local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = auVar2._0_8_ + 1;
  if (osize != 1) {
    lVar15 = 0;
    do {
      uVar3 = local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[lVar15];
      if (uVar3 - 1 == 0) {
        lVar17 = 1;
        lVar16 = 0;
      }
      else {
        uVar19 = 0;
        lVar17 = 0;
        lVar16 = 0;
        uVar18 = uVar3 - 1;
        do {
          lVar14 = lVar16 + sVar20;
          lVar16 = lVar16 + 1;
          uVar13 = uVar19 & 0x3f;
          uVar19 = uVar19 + 8;
          lVar17 = lVar17 + ((ulong)ibuff[lVar14] << uVar13);
          bVar4 = 0xff < uVar18;
          uVar18 = uVar18 >> 8;
        } while (bVar4);
        lVar17 = lVar17 + 1;
      }
      if ((lVar17 + uVar3 & 1) == 0) {
        uVar18 = (uVar3 - lVar17 >> 1) + 1;
      }
      else {
        uVar18 = lVar17 + uVar3 + 1 >> 1;
      }
      sVar20 = sVar20 + lVar16;
      lVar16 = lVar15 + 1;
      local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[lVar15 * 2 + 1] = uVar18;
      local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[lVar15 * 2 + 2] = (uVar3 - uVar18) + 1;
      lVar15 = lVar16;
    } while (lVar16 != osize - 1);
    if (osize == 0) goto LAB_0011eccb;
  }
  auVar22 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
  auVar23 = vpbroadcastq_avx512f();
  uVar18 = 0;
  do {
    auVar24 = vpbroadcastq_avx512f();
    auVar24 = vporq_avx512f(auVar24,auVar22);
    uVar19 = vpcmpuq_avx512f(auVar24,auVar23,2);
    auVar24 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                 (local_48.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start + osize + (uVar18 - 1)));
    auVar25._8_8_ = (ulong)((byte)(uVar19 >> 1) & 1) * auVar24._8_8_;
    auVar25._0_8_ = (ulong)((byte)uVar19 & 1) * auVar24._0_8_;
    auVar25._16_8_ = (ulong)((byte)(uVar19 >> 2) & 1) * auVar24._16_8_;
    auVar25._24_8_ = (ulong)((byte)(uVar19 >> 3) & 1) * auVar24._24_8_;
    auVar25._32_8_ = (ulong)((byte)(uVar19 >> 4) & 1) * auVar24._32_8_;
    auVar25._40_8_ = (ulong)((byte)(uVar19 >> 5) & 1) * auVar24._40_8_;
    auVar25._48_8_ = (ulong)((byte)(uVar19 >> 6) & 1) * auVar24._48_8_;
    auVar25._56_8_ = (uVar19 >> 7) * auVar24._56_8_;
    puVar1 = obuff + uVar18;
    auVar21 = vpmovqd_avx512f(auVar25);
    bVar4 = (bool)((byte)uVar19 & 1);
    bVar5 = (bool)((byte)(uVar19 >> 1) & 1);
    bVar6 = (bool)((byte)(uVar19 >> 2) & 1);
    bVar7 = (bool)((byte)(uVar19 >> 3) & 1);
    bVar8 = (bool)((byte)(uVar19 >> 4) & 1);
    bVar9 = (bool)((byte)(uVar19 >> 5) & 1);
    bVar10 = (bool)((byte)(uVar19 >> 6) & 1);
    bVar11 = SUB81(uVar19 >> 7,0);
    *puVar1 = (uint)bVar4 * auVar21._0_4_ | (uint)!bVar4 * *puVar1;
    puVar1[1] = (uint)bVar5 * auVar21._4_4_ | (uint)!bVar5 * puVar1[1];
    puVar1[2] = (uint)bVar6 * auVar21._8_4_ | (uint)!bVar6 * puVar1[2];
    puVar1[3] = (uint)bVar7 * auVar21._12_4_ | (uint)!bVar7 * puVar1[3];
    puVar1[4] = (uint)bVar8 * auVar21._16_4_ | (uint)!bVar8 * puVar1[4];
    puVar1[5] = (uint)bVar9 * auVar21._20_4_ | (uint)!bVar9 * puVar1[5];
    puVar1[6] = (uint)bVar10 * auVar21._24_4_ | (uint)!bVar10 * puVar1[6];
    puVar1[7] = (uint)bVar11 * auVar21._28_4_ | (uint)!bVar11 * puVar1[7];
    uVar18 = uVar18 + 8;
  } while ((osize + 7 & 0xfffffffffffffff8) != uVar18);
LAB_0011eccb:
  operator_delete(local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start,
                  (long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start);
  return sVar20;
}

Assistant:

size_t interp_decompress(uint32_t* obuff, /* output buffer */
    size_t osize, /* number symbols to be decoded */
    const uint8_t* ibuff, /* input buffer */
    size_t isize)
{ /* size of input buffer */
    int i, p;
    uint64_t vp, vl, vr, v;
    size_t ip = 0;

    std::vector<uint64_t> T(2 * osize - 1);
    ip += byte_decode(ibuff + ip, isize - ip, (1LL << 63), T.data());
    for (p = 0; p < osize - 1; p++) {
        vp = T[p];
        ip += byte_decode(ibuff + ip, isize - ip, vp, &v);
        if (((v + vp) & 1) == 0) {
            vl = 1 + ((vp - v) >> 1);
        } else {
            vl = (vp + v + 1) >> 1;
        }
        vr = vp - vl + 1;
        T[2 * p + 1] = vl;
        T[2 * p + 2] = vr;
    }
    for (i = 0; i < osize; i++) {
        obuff[i] = T[i + osize - 1];
    }
    return ip;
}